

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall
kratos::FSMState::output(FSMState *this,shared_ptr<kratos::Var> *output_var,int64_t value)

{
  uint32_t width;
  Const *pCVar1;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  width = (*(((output_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  pCVar1 = Const::constant(value,width,
                           ((output_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->is_signed_);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            (local_30,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                      &(pCVar1->super_Var).super_enable_shared_from_this<kratos::Var>);
  output(this,output_var,(shared_ptr<kratos::Var> *)local_30);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void FSMState::output(const std::shared_ptr<Var>& output_var, int64_t value) {
    auto& c = constant(value, output_var->width(), output_var->is_signed());
    output(output_var, c.shared_from_this());
}